

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmFindCommon *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  cmMakefile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string_view name;
  bool bVar2;
  bool bVar3;
  int iVar4;
  optional<cmWindowsRegistry::View> oVar5;
  cmState *this_02;
  cmValue cVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  pointer pbVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  undefined4 uVar16;
  anon_class_8_1_d1845f1d_for__M_pred __pred;
  cmFindBase *this_03;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  shortArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  macros;
  Command command;
  char local_149;
  _Alloc_hider in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  cmFindCommon *local_f8;
  string *local_f0;
  long local_e8;
  cmFindBase *local_e0;
  undefined1 local_d8 [48];
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  string *local_58;
  _Any_data local_50;
  code *local_40;
  
  uVar15 = (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar15 < 2) {
    _Var14._M_p = (pointer)local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffeb8,"called with incorrect number of arguments","");
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)&stack0xfffffffffffffeb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p != local_138) {
      operator_delete(_Var14._M_p,local_138[0]._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f0 = (string *)&this->VariableDocumentation;
    uVar12 = 0;
    bVar2 = false;
    uVar11 = 0;
    local_e0 = this;
    do {
      pbVar13 = (argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (bVar2) {
LAB_00534638:
        iVar4 = std::__cxx11::string::compare((char *)(pbVar13 + uVar12));
        if (iVar4 == 0) {
          local_e0->StoreResultInCache = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar4 == 0) {
            uVar10 = uVar11 + 1;
            if (uVar10 < uVar15) {
              cmsys::SystemTools::GetPath
                        (&local_118,
                         (argsIn->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p);
              uVar11 = uVar10;
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_118,
                        (argsIn->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar12);
          }
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar13 + uVar12));
        if (iVar4 != 0) {
          pbVar13 = (argsIn->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00534638;
        }
        if (uVar11 + 1 < uVar15) {
          bVar2 = true;
          std::__cxx11::string::_M_assign(local_f0);
          uVar11 = uVar11 + 1;
        }
        else {
          bVar2 = false;
        }
      }
      this_03 = local_e0;
      uVar11 = uVar11 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar12 < uVar15);
    if ((ulong)((long)local_118.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      _Var14._M_p = (pointer)local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffeb8,"called with incorrect number of arguments","");
      cmFindCommon::SetError(&local_e0->super_cmFindCommon,(string *)&stack0xfffffffffffffeb8);
      local_d8._16_8_ = local_138[0]._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != local_138) {
LAB_0053472e:
        operator_delete(_Var14._M_p,local_d8._16_8_ + 1);
      }
LAB_00534736:
      bVar2 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_e0->VariableName);
      bVar2 = CheckForVariableDefined(this_03);
      if (bVar2) {
        this_03->AlreadyDefined = true;
        bVar2 = true;
      }
      else {
        this_00 = &this_03->super_cmFindCommon;
        cmFindCommon::SelectDefaultSearchModes(this_00);
        cmFindCommon::SelectDefaultRootPathMode(this_00);
        cmFindCommon::SelectDefaultMacMode(this_00);
        local_f8 = this_00;
        if ((ulong)((long)local_118.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          bVar2 = false;
        }
        else {
          local_60 = &(this_03->super_cmFindCommon).UserGuessArgs;
          local_68 = &this_03->Names;
          local_58 = (string *)&this_03->ValidatorName;
          uVar16 = 1;
          uVar15 = 1;
          bVar2 = false;
          do {
            uVar11 = (uint)uVar15;
            iVar4 = std::__cxx11::string::compare
                              ((char *)(local_118.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar4 == 0) {
              uVar16 = 1;
LAB_0053494a:
              bVar2 = true;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15));
              if (iVar4 == 0) {
                uVar16 = 2;
                goto LAB_0053494a;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15));
              if (iVar4 == 0) {
                uVar16 = 4;
                goto LAB_0053494a;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15));
              if (iVar4 == 0) {
                uVar16 = 3;
                goto LAB_0053494a;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15));
              if (iVar4 == 0) {
                if (this_03->NamesPerDirAllowed != true) {
                  _Var14._M_p = (pointer)local_138;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&stack0xfffffffffffffeb8,"does not support NAMES_PER_DIR","")
                  ;
                  cmFindCommon::SetError(local_f8,(string *)&stack0xfffffffffffffeb8);
                  goto LAB_00534f45;
                }
                this_03->NamesPerDir = true;
LAB_0053498e:
                uVar16 = 0;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_118.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar15));
                if (iVar4 == 0) {
                  (this_03->super_cmFindCommon).NoDefaultPath = true;
                  goto LAB_0053498e;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_118.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar15));
                if (iVar4 == 0) {
                  this_03->Required = true;
                  uVar16 = 0;
                  goto LAB_0053494a;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_118.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar15));
                if (iVar4 == 0) {
                  uVar11 = uVar11 + 1;
                  uVar15 = (ulong)uVar11;
                  if ((long)local_118.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar15) {
                    _Var14._M_p = (pointer)local_138;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&stack0xfffffffffffffeb8,
                               "missing required argument for \"REGISTRY_VIEW\"","");
                    cmFindCommon::SetError(local_f8,(string *)&stack0xfffffffffffffeb8);
LAB_00534f45:
                    local_d8._16_8_ = local_138[0]._M_allocated_capacity;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var14._M_p == local_138) goto LAB_00534736;
                    goto LAB_0053472e;
                  }
                  name._M_str = in_stack_fffffffffffffec0;
                  name._M_len = (size_t)in_stack_fffffffffffffeb8._M_p;
                  oVar5 = cmWindowsRegistry::ToView(name);
                  if (((ulong)oVar5.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) {
                    local_138[0]._8_8_ =
                         local_118.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p;
                    local_138[0]._0_8_ =
                         local_118.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length;
                    views._M_len = 2;
                    views._M_array = (iterator)&stack0xfffffffffffffeb8;
                    cmCatViews_abi_cxx11_((string *)local_d8,views);
                    cmFindCommon::SetError(local_f8,(string *)local_d8);
                    _Var14._M_p = (pointer)local_d8._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_d8 + 0x10)) goto LAB_0053472e;
                    goto LAB_00534736;
                  }
                  (this_03->super_cmFindCommon).RegistryView =
                       oVar5.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                       super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)(local_118.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar15));
                  if (iVar4 == 0) {
                    uVar11 = uVar11 + 1;
                    uVar15 = (ulong)uVar11;
                    if ((long)local_118.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_118.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar15) {
                      _Var14._M_p = (pointer)local_138;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&stack0xfffffffffffffeb8,
                                 "missing required argument for \"VALIDATOR\"","");
                      cmFindCommon::SetError(local_f8,(string *)&stack0xfffffffffffffeb8);
                      goto LAB_00534f45;
                    }
                    this_02 = cmMakefile::GetState((this_03->super_cmFindCommon).Makefile);
                    local_e8 = uVar15 * 0x20;
                    cmState::GetCommand((Command *)&local_50,this_02,
                                        local_118.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar15);
                    if (local_40 == (code *)0x0) {
                      local_d8._8_8_ =
                           *(long *)((long)&((local_118.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + local_e8);
                      local_d8._0_8_ =
                           *(undefined8 *)
                            ((long)&(local_118.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_e8);
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT71(local_88.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2e);
                      cmStrCat<char>(&local_a8,(cmAlphaNum *)&stack0xfffffffffffffeb8,
                                     (cmAlphaNum *)local_d8,(char *)&local_88);
                      cmFindCommon::SetError(local_f8,&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_40 != (code *)0x0) {
                        (*local_40)(&local_50,&local_50,__destroy_functor);
                      }
                      goto LAB_00534736;
                    }
                    __pred.validatorName =
                         (value_type *)
                         ((long)&((local_118.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         local_e8);
                    this_01 = (this_03->super_cmFindCommon).Makefile;
                    in_stack_fffffffffffffeb8._M_p = (pointer)local_138;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&stack0xfffffffffffffeb8,"MACROS","");
                    cVar6 = cmMakefile::GetProperty(this_01,(string *)&stack0xfffffffffffffeb8);
                    if (cVar6.Value == (string *)0x0) {
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    }
                    else {
                      arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
                      arg._M_len = (cVar6.Value)->_M_string_length;
                      cmExpandedList_abi_cxx11_(&local_88,arg,false);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)in_stack_fffffffffffffeb8._M_p != local_138) {
                      operator_delete(in_stack_fffffffffffffeb8._M_p,
                                      local_138[0]._M_allocated_capacity + 1);
                    }
                    _Var7 = std::
                            find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,__pred);
                    local_70 = local_88.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    if (_Var7._M_current ==
                        local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::_M_assign(local_58);
                    }
                    else {
                      in_stack_fffffffffffffeb8._M_p = (pointer)0x35;
                      in_stack_fffffffffffffec0 =
                           "command specified for \"VALIDATOR\" is not a function: ";
                      local_d8._8_8_ =
                           *(long *)((long)&((local_118.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + local_e8);
                      local_d8._0_8_ =
                           *(undefined8 *)
                            ((long)&(local_118.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_e8);
                      local_149 = '.';
                      cmStrCat<char>(&local_a8,(cmAlphaNum *)&stack0xfffffffffffffeb8,
                                     (cmAlphaNum *)local_d8,&local_149);
                      cmFindCommon::SetError(local_f8,&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_88);
                    if (local_40 != (code *)0x0) {
                      (*local_40)(&local_50,&local_50,__destroy_functor);
                    }
                    this_03 = local_e0;
                    if (_Var7._M_current != local_70) goto LAB_00534736;
                  }
                  else {
                    bVar3 = cmFindCommon::CheckCommonArgument
                                      (local_f8,local_118.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar15);
                    if (bVar3) goto LAB_0053498e;
                    switch(uVar16) {
                    case 1:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_68,local_118.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar15);
                      uVar16 = 1;
                      break;
                    case 2:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_60,local_118.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar15);
                      uVar16 = 2;
                      break;
                    case 3:
                      cmFindCommon::AddPathSuffix
                                (local_f8,local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar15);
                      uVar16 = 3;
                      break;
                    case 4:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_f8->UserHintsArgs,
                                  local_118.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar15);
                      uVar16 = 4;
                    }
                  }
                }
              }
            }
            uVar15 = (ulong)(uVar11 + 1);
          } while (uVar15 < (ulong)((long)local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if ((this_03->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_f0,0,(char *)0x0,0x795312);
          __rhs = (this_03->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar1) {
            std::__cxx11::string::append((char *)local_f0);
          }
          else {
            if ((long)pbVar1 - (long)__rhs == 0x20) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,"the ",__rhs);
              plVar8 = (long *)std::__cxx11::string::append(local_d8);
              _Var14._M_p = (pointer)local_138;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 == paVar9) {
                local_138[0]._0_8_ = paVar9->_M_allocated_capacity;
                local_138[0]._8_8_ = plVar8[3];
              }
              else {
                local_138[0]._0_8_ = paVar9->_M_allocated_capacity;
                _Var14._M_p = (pointer)*plVar8;
              }
              in_stack_fffffffffffffec0 = (char *)plVar8[1];
              *plVar8 = (long)paVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_f0,(ulong)_Var14._M_p);
            }
            else {
              std::__cxx11::string::append((char *)local_f0);
              local_d8._0_8_ =
                   (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_d8._8_8_ =
                   (this_03->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              separator._M_str = ", ";
              separator._M_len = 2;
              cmJoin((string *)&stack0xfffffffffffffeb8,(cmStringRange *)local_d8,separator,
                     (string_view)ZEXT816(0));
              std::__cxx11::string::_M_append
                        ((char *)local_f0,(ulong)in_stack_fffffffffffffeb8._M_p);
              _Var14._M_p = (pointer)local_138;
              if (in_stack_fffffffffffffeb8._M_p != _Var14._M_p) {
                operator_delete(in_stack_fffffffffffffeb8._M_p,
                                local_138[0]._M_allocated_capacity + 1);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8," or ",
                             (this_03->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              plVar8 = (long *)std::__cxx11::string::append(local_d8);
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 == paVar9) {
                local_138[0]._0_8_ = paVar9->_M_allocated_capacity;
                local_138[0]._8_8_ = plVar8[3];
              }
              else {
                local_138[0]._0_8_ = paVar9->_M_allocated_capacity;
                _Var14._M_p = (pointer)*plVar8;
              }
              in_stack_fffffffffffffec0 = (char *)plVar8[1];
              *plVar8 = (long)paVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_f0,(ulong)_Var14._M_p);
            }
            in_stack_fffffffffffffeb8._M_p = _Var14._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_p != local_138) {
              operator_delete(_Var14._M_p,local_138[0]._M_allocated_capacity + 1);
              in_stack_fffffffffffffeb8._M_p = _Var14._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
          }
        }
        if ((!bVar2) &&
           ((this_03->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_03->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __x = &this_03->Names;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffeb8,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(__x,(__x->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__x,(value_type *)in_stack_fffffffffffffeb8._M_p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(this_03->super_cmFindCommon).UserGuessArgs,
                     (this_03->super_cmFindCommon).UserGuessArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     in_stack_fffffffffffffeb8._M_p + 0x20,in_stack_fffffffffffffec0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffeb8);
        }
        ExpandPaths(this_03);
        bVar2 = true;
        cmFindCommon::ComputeFinalPaths(local_f8,Yes);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
  }
  return bVar2;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      auto macros = cmExpandedList(this->Makefile->GetProperty("MACROS"));
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}